

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdistancefield.cpp
# Opt level: O0

void __thiscall
QDistanceField::setGlyph(QDistanceField *this,QRawFont *font,glyph_t glyph,bool doubleResolution)

{
  int iVar1;
  QDistanceFieldData *pQVar2;
  undefined1 in_CL;
  glyph_t in_EDX;
  undefined8 in_RSI;
  QRawFont *in_RDI;
  long in_FS_OFFSET;
  QPainterPath path;
  QRawFont renderFont;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  QExplicitlySharedDataPointer<QRawFontPrivate> this_00;
  qreal in_stack_ffffffffffffff68;
  QRectF *this_01;
  undefined1 doubleResolution_00;
  undefined3 in_stack_ffffffffffffff90;
  uint uVar3;
  quint32 glyphIndex;
  QRectF local_58;
  QPointF local_38;
  QPointF local_28;
  QRawFont local_18;
  undefined1 *local_10;
  long local_8;
  
  glyphIndex = (quint32)((ulong)in_RSI >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = CONCAT13(in_CL,in_stack_ffffffffffffff90) & 0x1ffffff;
  this_00.d.ptr = (totally_ordered_wrapper<QRawFontPrivate_*>)&DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  doubleResolution_00 = (undefined1)((ulong)&local_10 >> 0x38);
  QRawFont::QRawFont((QRawFont *)&DAT_aaaaaaaaaaaaaaaa,
                     (QRawFont *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  iVar1 = QT_DISTANCEFIELD_BASEFONTSIZE(false);
  QT_DISTANCEFIELD_SCALE(false);
  QRawFont::setPixelSize(in_RDI,in_stack_ffffffffffffff68);
  local_18.d.d.ptr =
       (QExplicitlySharedDataPointer<QRawFontPrivate>)
       (QExplicitlySharedDataPointer<QRawFontPrivate>)this_00.d.ptr;
  QRawFont::pathForGlyph(&local_18,glyphIndex);
  this_01 = &local_58;
  QPainterPath::boundingRect((QPainterPath *)in_RDI);
  local_38 = QRectF::topLeft(this_01);
  local_28 = ::operator-((QPointF *)this_01);
  QPainterPath::translate((QPainterPath *)in_RDI,(QPointF *)this_01);
  QPainterPath::setFillRule((QPainterPath *)in_RDI,(FillRule)((ulong)this_01 >> 0x20));
  QDistanceFieldData::create((QPainterPath *)CONCAT44(in_EDX,uVar3),(bool)doubleResolution_00);
  QSharedDataPointer<QDistanceFieldData>::operator=
            ((QSharedDataPointer<QDistanceFieldData> *)this_00.d.ptr,
             (QDistanceFieldData *)CONCAT44(iVar1,in_stack_ffffffffffffff58));
  pQVar2 = QSharedDataPointer<QDistanceFieldData>::operator->
                     ((QSharedDataPointer<QDistanceFieldData> *)this_00.d.ptr);
  pQVar2->glyph = in_EDX;
  QPainterPath::~QPainterPath((QPainterPath *)0x705ce0);
  QRawFont::~QRawFont((QRawFont *)0x705cea);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDistanceField::setGlyph(const QRawFont &font, glyph_t glyph, bool doubleResolution)
{
    QRawFont renderFont = font;
    renderFont.setPixelSize(QT_DISTANCEFIELD_BASEFONTSIZE(doubleResolution) * QT_DISTANCEFIELD_SCALE(doubleResolution));

    QPainterPath path = renderFont.pathForGlyph(glyph);
    path.translate(-path.boundingRect().topLeft());
    path.setFillRule(Qt::WindingFill);

    d = QDistanceFieldData::create(path, doubleResolution);
    d->glyph = glyph;
}